

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall TPZMatrix<TFad<6,_double>_>::Decompose_LU(TPZMatrix<TFad<6,_double>_> *this)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  TFad<6,_double> nn;
  double dVar11;
  undefined8 uVar12;
  undefined **local_198;
  double local_190;
  undefined **ppuStack_188;
  double local_180 [5];
  undefined **local_158;
  double local_150;
  double adStack_148 [6];
  undefined **local_118;
  double local_110;
  undefined **local_108;
  double adStack_100 [5];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b0 [8];
  double local_a8;
  double adStack_a0 [6];
  undefined1 local_70 [8];
  double local_68;
  double adStack_60 [6];
  
  if (1 < (byte)(this->super_TPZBaseMatrix).fDecomposed) {
    Error("Decompose_LU <Matrix already Decomposed with other scheme>",(char *)0x0);
  }
  if ((this->super_TPZBaseMatrix).fDecomposed == '\0') {
    local_158 = &PTR__TFad_0185d2b8;
    local_150 = 0.0;
    adStack_148[0] = 0.0;
    adStack_148[1] = 0.0;
    adStack_148[2] = 0.0;
    adStack_148[3] = 0.0;
    adStack_148[4] = 0.0;
    adStack_148[5] = 0.0;
    local_198 = &PTR__TFad_0185d2b8;
    local_190 = 0.0;
    ppuStack_188 = (undefined **)0x0;
    local_180[0] = 0.0;
    local_180[1] = 0.0;
    local_180[2] = 0.0;
    local_180[3] = 0.0;
    local_180[4] = 0.0;
    lVar7 = (this->super_TPZBaseMatrix).fRow;
    lVar9 = (this->super_TPZBaseMatrix).fCol;
    if (lVar9 < lVar7) {
      lVar7 = lVar9;
    }
    if (0 < lVar7) {
      dVar11 = 0.0;
      uVar12 = 0;
      lVar9 = 0;
      do {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_118,this,lVar9,lVar9,in_R8,in_R9,dVar11,uVar12);
        local_180[3] = adStack_100[3];
        local_180[4] = adStack_100[4];
        local_180[1] = adStack_100[1];
        local_180[2] = adStack_100[2];
        ppuStack_188 = local_108;
        local_180[0] = adStack_100[0];
        uVar12 = 0;
        dVar11 = local_110;
        if (ABS(local_110) < 1e-12) {
          Error("Decompose_LU <matrix is singular>",(char *)0x0);
        }
        lVar1 = lVar9 + 1;
        if (lVar1 < (this->super_TPZBaseMatrix).fRow) {
          dVar2 = dVar11 * dVar11;
          local_d8._8_4_ = SUB84(dVar11,0);
          local_d8._0_8_ = dVar11;
          local_d8._12_4_ = (int)((ulong)dVar11 >> 0x20);
          local_c8._8_4_ = SUB84(dVar2,0);
          local_c8._0_8_ = dVar2;
          local_c8._12_4_ = (int)((ulong)dVar2 >> 0x20);
          lVar8 = lVar1;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_118,this,lVar8,lVar9);
            lVar5 = 2;
            do {
              auVar10._0_8_ =
                   (double)(&local_118)[lVar5] * (double)local_d8._0_8_ -
                   (double)(&local_198)[lVar5] * local_110;
              auVar10._8_8_ =
                   (&local_110)[lVar5] * (double)local_d8._8_8_ - (&local_190)[lVar5] * local_110;
              auVar10 = divpd(auVar10,local_c8);
              *(undefined1 (*) [16])(&local_158 + lVar5) = auVar10;
              lVar5 = lVar5 + 2;
            } while (lVar5 != 8);
            local_150 = local_110 / dVar11;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                      (this,lVar8,lVar9,&local_158);
            lVar5 = lVar1;
            if (lVar1 < (this->super_TPZBaseMatrix).fCol) {
              do {
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (local_70,this,lVar8,lVar5);
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (local_b0,this,lVar9,lVar5);
                local_118 = &PTR__TFad_0185d2b8;
                local_110 = local_68 - local_150 * local_a8;
                lVar6 = 0;
                do {
                  dVar2 = *(double *)((long)adStack_60 + lVar6 + 8);
                  dVar3 = *(double *)((long)adStack_148 + lVar6 + 8);
                  dVar4 = *(double *)((long)adStack_a0 + lVar6 + 8);
                  *(double *)((long)adStack_100 + lVar6 + -8) =
                       *(double *)((long)adStack_60 + lVar6) -
                       (*(double *)((long)adStack_a0 + lVar6) * local_150 +
                       *(double *)((long)adStack_148 + lVar6) * local_a8);
                  *(double *)((long)adStack_100 + lVar6) =
                       dVar2 - (dVar4 * local_150 + dVar3 * local_a8);
                  lVar6 = lVar6 + 0x10;
                } while (lVar6 != 0x30);
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                          (this,lVar8,lVar5,&local_118);
                lVar5 = lVar5 + 1;
              } while (lVar5 < (this->super_TPZBaseMatrix).fCol);
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < (this->super_TPZBaseMatrix).fRow);
        }
        lVar9 = lVar1;
      } while (lVar1 != lVar7);
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x01';
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LU() {
	
	if (  fDecomposed && fDecomposed != ELU)  Error( "Decompose_LU <Matrix already Decomposed with other scheme>" );
	if (fDecomposed) return 1;
	
	TVar nn, pivot;
	int64_t  min = ( Cols() < (Rows()) ) ? Cols() : Rows();
	
	for ( int64_t k = 0; k < min ; k++ ) {
		if (IsZero( pivot = GetVal(k, k))) Error( "Decompose_LU <matrix is singular>" );
		for ( int64_t i = k+1; i < Rows(); i++ ) {
			nn = GetVal( i, k ) / pivot;
			PutVal( i, k, nn );
			for ( int64_t j = k+1; j < Cols(); j++ ) PutVal(i,j,GetVal(i,j)-nn*GetVal(k,j));
		}
	}
	fDecomposed=ELU;
	return 1;
}